

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

BlurNode * rengine::BlurNode::create(void)

{
  bool bVar1;
  BlurNode *t;
  Node *local_10;
  
  bVar1 = AllocationPool<rengine::BlurNode>::isExhausted(&__allocation_pool_rengine_BlurNode);
  if (bVar1) {
    local_10 = (Node *)operator_new(0x38);
    BlurNode((BlurNode *)local_10);
  }
  else {
    local_10 = &AllocationPool<rengine::BlurNode>::allocate(&__allocation_pool_rengine_BlurNode)->
                super_Node;
    Node::__mark_as_pool_allocated(local_10);
  }
  return (BlurNode *)local_10;
}

Assistant:

static BlurNode *create(unsigned radius) {
        auto node = create();
        node->setRadius(radius);
        return node;
    }